

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O3

unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
 __thiscall
pfederc::Parser::fromExprToFunctionParam
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr)

{
  Expr *pEVar1;
  size_t sVar2;
  Lexer *pLVar3;
  _func_int **pp_Var4;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var5;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_38;
  long *local_30;
  
  pEVar1 = (in_RDX->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (pEVar1->type == EXPR_BIOP) {
    if (pEVar1->_vptr_Expr != (_func_int **)&PTR__BiOpExpr_0012b990) {
      __cxa_bad_cast();
    }
    if (*(short *)&pEVar1[1].parent != 0x43) {
      if (*(short *)&pEVar1[1].parent == 0x3d) {
        _Var5._M_head_impl = (Expr *)pEVar1[1].lexer;
        if (*(int *)&(((Lexer *)_Var5._M_head_impl)->filePath)._M_dataplus._M_p != 0x12) {
LAB_0011531f:
          local_38._M_head_impl = (Expr *)operator_new(0x38);
          sVar2 = *(size_t *)((long)&(((Lexer *)_Var5._M_head_impl)->filePath).field_2 + 8);
          *(Level *)&(local_38._M_head_impl)->_vptr_Expr = LVL_ERROR;
          *(SyntaxErrorCode *)((long)&(local_38._M_head_impl)->_vptr_Expr + 4) =
               STX_ERR_EXPECTED_GUARD;
          pLVar3 = (Lexer *)(((Lexer *)_Var5._M_head_impl)->filePath).field_2._M_allocated_capacity;
          ((Position *)&(local_38._M_head_impl)->parent)->line =
               (((Lexer *)_Var5._M_head_impl)->filePath)._M_string_length;
          (local_38._M_head_impl)->lexer = pLVar3;
          *(size_t *)&(local_38._M_head_impl)->type = sVar2;
          (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
           &((local_38._M_head_impl)->pos).line)->_M_impl).super__Vector_impl_data._M_start =
               (pointer)0x0;
          ((local_38._M_head_impl)->pos).startIndex = 0;
          ((local_38._M_head_impl)->pos).endIndex = 0;
          generateError((Parser *)&stack0xffffffffffffffd8,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)expr);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     &stack0xffffffffffffffd8);
          if (local_38._M_head_impl != (Expr *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_38,
                       (Error<pfederc::SyntaxErrorCode> *)local_38._M_head_impl);
          }
          this->lexer = (Lexer *)0x0;
          return (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                  )this;
        }
        if (((Lexer *)_Var5._M_head_impl)->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_0012b990) {
          __cxa_bad_cast();
        }
        if ((short)(((Lexer *)_Var5._M_head_impl)->fileContent)._M_string_length != 0x43)
        goto LAB_0011531f;
        pEVar1[1].lexer = (Lexer *)0x0;
        local_30 = *(long **)&pEVar1[1].type;
        *(undefined8 *)&pEVar1[1].type = 0;
        local_38._M_head_impl = _Var5._M_head_impl;
        fromExprGuardToFunctionParam
                  (this,expr,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_38);
        if (local_30 != (long *)0x0) {
          (**(code **)(*local_30 + 8))();
        }
        pp_Var4 = ((Lexer *)_Var5._M_head_impl)->_vptr_Lexer;
        goto LAB_001152f0;
      }
      goto LAB_001152b8;
    }
    local_38._M_head_impl = (Expr *)0x0;
    fromExprGuardToFunctionParam(this,expr,in_RDX);
  }
  else {
LAB_001152b8:
    local_38._M_head_impl = (Expr *)0x0;
    local_30 = (long *)0x0;
    fromExprDeclToFunctionParam
              (this,expr,in_RDX,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_38);
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
  }
  if ((Lexer *)local_38._M_head_impl == (Lexer *)0x0) {
    return (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
            )this;
  }
  pp_Var4 = (local_38._M_head_impl)->_vptr_Expr;
  _Var5._M_head_impl = local_38._M_head_impl;
LAB_001152f0:
  (*pp_Var4[1])(_Var5._M_head_impl);
  return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FuncParameter> Parser::fromExprToFunctionParam(
    std::unique_ptr<Expr> &&expr) noexcept {
  if (isBiOpExpr(*expr, TokenType::TOK_OP_ASG)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    // guard result
    if (!isBiOpExpr(biopexpr.getLeft(), TokenType::TOK_OP_BOR)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_GUARD, biopexpr.getLeft().getPosition()));
      return nullptr;
    }

    return fromExprGuardToFunctionParam(
      biopexpr.getLeftPtr(), biopexpr.getRightPtr());
  } else if (isBiOpExpr(*expr, TokenType::TOK_OP_BOR)) {
    // guard (requires)
    return fromExprGuardToFunctionParam(std::move(expr), nullptr);
  }

  return fromExprDeclToFunctionParam(std::move(expr), nullptr, nullptr);
}